

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kotak.h
# Opt level: O2

void __thiscall Kotak::Kotak(Kotak *this,Point<double> *a,Point<double> *b)

{
  Polygon::Polygon(&this->super_Polygon);
  Polygon::addPoint(&this->super_Polygon);
  Polygon::addPoint(&this->super_Polygon);
  Polygon::addPoint(&this->super_Polygon);
  Polygon::addPoint(&this->super_Polygon);
  return;
}

Assistant:

Kotak(Point<double> a, Point<double> b) {
    addPoint(a);
    addPoint(Point<double>(b.x, a.y));
    addPoint(b);
    addPoint(Point<double>(a.x, b.y));
  }